

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O0

void __thiscall HDual::solve(HDual *this,HModel *ptr_model,int variant,int num_threads)

{
  reference pvVar1;
  reference pvVar2;
  int *piVar3;
  undefined8 uVar4;
  uint in_ECX;
  int iVar5;
  int in_EDX;
  HModel *in_RSI;
  HDual *in_RDI;
  double dVar6;
  double bs_cond_1;
  HPrimal hPrimal;
  int it0_1;
  int reportCount_2;
  int reportList_2 [15];
  int reportCount_1;
  int reportList_1 [16];
  int reportCount;
  int reportList [14];
  int it0;
  bool ok;
  double myDual;
  int i_1;
  double largeDual;
  double bs_cond;
  bool rp_bs_cond;
  int i;
  double IzDseEdWtTT;
  int numBasicStructurals;
  size_type in_stack_fffffffffffffc18;
  HDual *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc2c;
  HFactor *in_stack_fffffffffffffc30;
  HDual *in_stack_fffffffffffffc40;
  int *in_stack_fffffffffffffc48;
  HDual *in_stack_fffffffffffffc50;
  double local_3a8;
  int local_3a0;
  double local_398;
  HModel *in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffcac;
  HModel *in_stack_fffffffffffffcb0;
  HModel *in_stack_fffffffffffffcc0;
  HModel *in_stack_fffffffffffffcf8;
  HDual *in_stack_fffffffffffffd00;
  undefined1 local_128 [60];
  undefined4 local_ec;
  undefined1 local_e8 [76];
  undefined4 local_9c;
  undefined1 local_98 [64];
  int local_58;
  undefined1 local_51;
  pointer local_50;
  int local_44;
  pointer local_40;
  byte local_2d;
  int local_2c;
  pointer local_28;
  uint local_20;
  int local_1c;
  uint local_18;
  
  in_RDI->dual_variant = in_EDX;
  in_RDI->model = in_RSI;
  local_18 = in_ECX;
  printf("model->mlFg_Report() 1\n");
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  HModel::mlFg_Report((HModel *)in_stack_fffffffffffffc20);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  HVector::setup((HVector *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
  HVector::setup((HVector *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c);
  HModel::setup_for_solve(in_stack_fffffffffffffca0);
  in_RDI->model->problemStatus = -1;
  in_RDI->model->numberIteration = 0;
  in_RDI->totalRebuilds = 0;
  in_RDI->totalRebuildTime = 0.0;
  in_RDI->model->totalInverts = 0;
  in_RDI->model->totalInvertTime = 0.0;
  if (in_RDI->model->numRow != 0) {
    printf("model->mlFg_Report() 2\n");
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    HModel::mlFg_Report((HModel *)in_stack_fffffffffffffc20);
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    HTimer::reset((HTimer *)in_stack_fffffffffffffc20);
    in_RDI->n_ph1_du_it = 0;
    in_RDI->n_ph2_du_it = 0;
    in_RDI->n_pr_it = 0;
    in_RDI->SolveBailout = false;
    if ((in_RDI->TimeLimitValue == 0.0) && (!NAN(in_RDI->TimeLimitValue))) {
      in_RDI->TimeLimitValue = 1000000.0;
      printf("Setting TimeLimitValue = %g\n",in_RDI->TimeLimitValue);
    }
    init(in_RDI,(EVP_PKEY_CTX *)(ulong)local_18);
    HModel::initCost(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
    if (in_RDI->model->mlFg_haveFreshInvert == 0) {
      HModel::computeFactor((HModel *)in_stack_fffffffffffffc50);
    }
    if (in_RDI->model->mlFg_haveEdWt == 0) {
      if (in_RDI->EdWt_Mode == 1) {
        in_RDI->n_dvx_fwk = 0;
        local_1c = 0;
        std::vector<int,_std::allocator<int>_>::assign
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc20,
                   in_stack_fffffffffffffc18,(value_type *)0x146f0b);
        iz_dvx_fwk(in_stack_fffffffffffffc20);
      }
      else if (in_RDI->EdWt_Mode == 0) {
        in_RDI->n_wg_DSE_wt = 0;
        local_20 = in_RDI->numRow - in_RDI->model->numBasicLogicals;
        if (((int)local_20 < 1) || ((in_RDI->iz_DSE_wt & 1U) == 0)) {
          printf("solve:: %d basic structurals: starting from B=I so unit initial DSE weights\n",
                 (ulong)local_20);
        }
        else {
          local_28 = (pointer)HTimer::getTime((HTimer *)in_stack_fffffffffffffc20);
          for (local_2c = 0; local_2c < in_RDI->numRow; local_2c = local_2c + 1) {
            HVector::clear((HVector *)in_stack_fffffffffffffc40);
            (in_RDI->row_ep).count = 1;
            iVar5 = local_2c;
            pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&(in_RDI->row_ep).index,0);
            *pvVar1 = iVar5;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&(in_RDI->row_ep).array,(long)local_2c);
            *pvVar2 = 1.0;
            (in_RDI->row_ep).packFlag = false;
            HFactor::btran(in_stack_fffffffffffffc30,
                           (HVector *)CONCAT44(iVar5,in_stack_fffffffffffffc28),
                           (double)in_stack_fffffffffffffc20);
            in_stack_fffffffffffffc30 =
                 (HFactor *)HVector::norm2((HVector *)in_stack_fffffffffffffc50);
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               (&(in_RDI->dualRHS).workEdWt,(long)local_2c);
            *pvVar2 = (value_type)in_stack_fffffffffffffc30;
            in_RDI->row_epDensity = in_RDI->row_epDensity * 0.95;
            in_RDI->row_epDensity =
                 ((double)(in_RDI->row_ep).count * 0.05) / (double)in_RDI->numRow +
                 in_RDI->row_epDensity;
          }
          dVar6 = HTimer::getTime((HTimer *)in_stack_fffffffffffffc20);
          local_28 = (pointer)(dVar6 - (double)local_28);
          printf("Computed %d initial DSE weights in %gs\n",local_28,(ulong)(uint)in_RDI->numRow);
          printf("solve:: %d basic structurals: computed %d initial DSE weights in %gs, %d, %d, %g\n"
                 ,local_28,(int)local_28,(ulong)local_20,(ulong)(uint)in_RDI->numRow,(ulong)local_20
                 ,(ulong)(uint)in_RDI->numRow);
        }
      }
      in_RDI->model->mlFg_haveEdWt = 1;
    }
    HModel::computeDual(in_stack_fffffffffffffcc0);
    local_2d = 0;
    HModel::computeDualInfeasInDual((HModel *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    iVar5 = 2;
    if (0 < in_RDI->dualInfeasCount) {
      iVar5 = 1;
    }
    in_RDI->solvePhase = iVar5;
    local_40 = (pointer)0x0;
    for (local_44 = 0; local_44 < in_RDI->numTot; local_44 = local_44 + 1) {
      piVar3 = HModel::getNonbasicFlag((HModel *)0x14724d);
      if ((piVar3[local_44] != 0) &&
         (local_50 = (pointer)ABS(in_RDI->workDual[local_44] * (double)in_RDI->jMove[local_44]),
         (double)local_40 < (double)local_50)) {
        local_40 = local_50;
      }
    }
    local_51 = HModel::OKtoSolve((HModel *)in_RDI,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                                 (int)in_stack_fffffffffffffc30);
    if (!(bool)local_51) {
      printf("NOT OK TO SOLVE???\n");
      std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    }
    while (in_RDI->solvePhase != 0) {
      local_58 = in_RDI->model->numberIteration;
      iVar5 = in_RDI->solvePhase;
      if (iVar5 == 1) {
        solve_phase1(in_stack_fffffffffffffc40);
        in_RDI->n_ph1_du_it = (in_RDI->model->numberIteration - local_58) + in_RDI->n_ph1_du_it;
      }
      else if (iVar5 == 2) {
        solve_phase2(in_stack_fffffffffffffc50);
        in_RDI->n_ph2_du_it = (in_RDI->model->numberIteration - local_58) + in_RDI->n_ph2_du_it;
      }
      else if (iVar5 != 4) {
        in_RDI->solvePhase = 0;
      }
      if ((in_RDI->solvePhase == 4) || ((in_RDI->SolveBailout & 1U) != 0)) break;
    }
    if (in_RDI->dual_variant == 0) {
      memcpy(local_98,&DAT_001cc8e0,0x38);
      local_9c = 0xe;
      HTimer::report((HTimer *)in_stack_fffffffffffffc40,(int)((ulong)in_RDI >> 0x20),
                     &in_stack_fffffffffffffc30->pseudoTick);
    }
    if (in_RDI->dual_variant == 1) {
      memcpy(local_e8,&DAT_001cc920,0x40);
      local_ec = 0x10;
      HTimer::report((HTimer *)in_stack_fffffffffffffc40,(int)((ulong)in_RDI >> 0x20),
                     &in_stack_fffffffffffffc30->pseudoTick);
    }
    if (in_RDI->dual_variant == 2) {
      memcpy(local_128,&DAT_001cc960,0x3c);
      HTimer::report((HTimer *)in_stack_fffffffffffffc40,(int)((ulong)in_RDI >> 0x20),
                     &in_stack_fffffffffffffc30->pseudoTick);
      uVar4 = std::__cxx11::string::c_str();
      printf("PAMI   %-20s    CUTOFF  %6g    PERSISTENSE  %6g\n",in_RDI->model->dblOption[4],
             SUB84((double)in_RDI->model->numberIteration / ((double)in_RDI->multi_iteration + 1.0),
                   0),uVar4);
    }
    if (in_RDI->model->problemStatus != 6) {
      iVar5 = in_RDI->model->numberIteration;
      if (in_RDI->solvePhase == 4) {
        in_stack_fffffffffffffc20 = (HDual *)&local_3a8;
        HPrimal::HPrimal((HPrimal *)in_stack_fffffffffffffc20);
        local_3a8 = in_RDI->TimeLimitValue;
        HPrimal::solvePhase2((HPrimal *)in_stack_fffffffffffffc40,(HModel *)in_RDI);
        in_RDI->totalRebuildTime = local_398 + in_RDI->totalRebuildTime;
        in_RDI->totalRebuilds = local_3a0 + in_RDI->totalRebuilds;
        HPrimal::~HPrimal((HPrimal *)in_stack_fffffffffffffc20);
      }
      in_RDI->n_pr_it = (in_RDI->model->numberIteration - iVar5) + in_RDI->n_pr_it;
    }
    dVar6 = HTimer::getTime((HTimer *)in_stack_fffffffffffffc20);
    in_RDI->model->totalTime = dVar6 + in_RDI->model->totalTime;
    if (in_RDI->n_ph1_du_it + in_RDI->n_ph2_du_it + in_RDI->n_pr_it !=
        in_RDI->model->numberIteration) {
      printf("Iteration total error \n");
    }
    printf("Iterations [Ph1 %d; Ph2 %d; Pr %d] Total %d\n",(ulong)(uint)in_RDI->n_ph1_du_it,
           (ulong)(uint)in_RDI->n_ph2_du_it,(ulong)(uint)in_RDI->n_pr_it,
           (ulong)(uint)in_RDI->model->numberIteration);
    if (in_RDI->EdWt_Mode == 1) {
      printf("Devex: n_dvx_fwk = %d; Average n_dvx_it = %d\n",(ulong)(uint)in_RDI->n_dvx_fwk,
             (long)in_RDI->model->numberIteration / (long)in_RDI->n_dvx_fwk & 0xffffffff);
    }
    if ((local_2d & 1) != 0) {
      dVar6 = an_bs_cond(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      printf("Optimal basis condition estimate is %g\n",dVar6);
    }
    local_51 = HModel::OKtoSolve((HModel *)in_RDI,(int)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                                 (int)in_stack_fffffffffffffc30);
    if (!(bool)local_51) {
      printf("NOT OK After Solve???\n");
      std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    }
    printf("model->mlFg_Report() 9\n");
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    HModel::mlFg_Report((HModel *)in_stack_fffffffffffffc20);
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    printf("Time: Total inverts =  %4d; Total invert  time = %11.4g of Total time = %11.4g",
           in_RDI->model->totalInvertTime,SUB84(in_RDI->model->totalTime,0),
           (ulong)(uint)in_RDI->model->totalInverts);
    if (in_RDI->model->totalTime <= 0.001) {
      printf("\n");
    }
    else {
      printf(" (%6.2f%%)\n",(in_RDI->model->totalInvertTime * 100.0) / in_RDI->model->totalTime);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
    printf("Time: Total rebuilds = %4d; Total rebuild time = %11.4g of Total time = %11.4g",
           in_RDI->totalRebuildTime,SUB84(in_RDI->model->totalTime,0),
           (ulong)(uint)in_RDI->totalRebuilds);
    if (in_RDI->model->totalTime <= 0.001) {
      printf("\n");
    }
    else {
      printf(" (%6.2f%%)\n",(in_RDI->totalRebuildTime * 100.0) / in_RDI->model->totalTime);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void HDual::solve(HModel *ptr_model, int variant, int num_threads) {
  //  printf("\nEntering solve(HModel *ptr_model, int variant, int num_threads)\n");cout<<flush;
  assert(ptr_model != NULL);
  dual_variant = variant;
  model = ptr_model;
#ifdef JAJH_dev
  printf("model->mlFg_Report() 1\n");cout<<flush; model->mlFg_Report();cout<<flush;
#endif
  //  printf("HDual::solve - model->mlFg_Report() 1\n");cout<<flush; model->mlFg_Report();cout<<flush;
  // Setup two work buffers in model required for solve()
  model->buffer.setup(model->numRow);
  model->bufferLong.setup(model->numCol);
  
  //  printf("model->mlFg_haveEdWt 0 = %d\n", model->mlFg_haveEdWt);cout<<flush;
  
  // Setup aspects of the model data which are needed for solve() but better left until now for efficiency reasons.
  //  printf("HDual::solve - Calling model->setup_for_solve()\n");cout<<flush;
  model->setup_for_solve();
  
  //  printf("model->mlFg_haveEdWt 1 = %d\n", model->mlFg_haveEdWt);cout<<flush;

  model->problemStatus = LP_Status_Unset;
  model->numberIteration = 0;
  //Initialise numbers and times of rebuilds and inverts.
  totalRebuilds = 0;
  totalRebuildTime = 0;
  model->totalInverts = 0;
  model->totalInvertTime = 0;
  //Cannot solve box-constrained LPs
  if (model->numRow == 0) return;
#ifdef JAJH_dev
  printf("model->mlFg_Report() 2\n");cout<<flush; model->mlFg_Report();cout<<flush;
#endif

  model->timer.reset();

  n_ph1_du_it = 0;
  n_ph2_du_it = 0;
  n_pr_it = 0;
  //Set SolveBailout to be true if control is to be returned immediately to calling function
  SolveBailout = false;
  if (TimeLimitValue == 0) {
    TimeLimitValue = 1000000.0;
#ifdef JAJH_dev
    printf("Setting TimeLimitValue = %g\n", TimeLimitValue);
#endif
  }
  
  // Initialise working environment
  //Does LOTS, including initialisation of edge weights. Should only
  //be called if model dimension changes
  init(num_threads);
  
  model->initCost(1);
  if (!model->mlFg_haveFreshInvert) model->computeFactor();

  //Consider initialising edge weights
  //
  //NB workEdWt is assigned and initialised to 1s in
  //dualRHS.setup(model) so that CHUZR is well defined, even for
  //Dantzig pricing
  //
  //  printf("model->mlFg_haveEdWt 2 = %d\n", model->mlFg_haveEdWt);cout<<flush;
  if (!model->mlFg_haveEdWt) {
    //Edge weights are not known
    //Set up edge weights according to EdWt_Mode and iz_DSE_wt
    if (EdWt_Mode == EdWt_Mode_Dvx) {
      //Using dual Devex edge weights
      //Zero the number of Devex frameworks used and set up the first one
      n_dvx_fwk = 0;
      dvx_ix.assign(numTot, 0);
      iz_dvx_fwk();}
    else if (EdWt_Mode == EdWt_Mode_DSE) {
      //Using dual steepest edge (DSE) weights
#ifdef JAJH_dev
      n_wg_DSE_wt = 0;
#endif
      int numBasicStructurals = numRow - model->numBasicLogicals;
      if (numBasicStructurals > 0 && iz_DSE_wt) {
	//Basis is not logical and DSE weights are to be initialised
	//printf("Compute exct DSE weights\n");
	double IzDseEdWtTT = model->timer.getTime();
	for (int i = 0; i < numRow; i++) {
	  row_ep.clear();
	  row_ep.count = 1;
	  row_ep.index[0] = i;
	  row_ep.array[i] = 1;
	  row_ep.packFlag = false;
	  factor->btran(row_ep, row_epDensity);
	  dualRHS.workEdWt[i] = row_ep.norm2();
	  row_epDensity *= 0.95;
	  row_epDensity += 0.05 * row_ep.count / numRow;
	}
	IzDseEdWtTT = model->timer.getTime() - IzDseEdWtTT;
#ifdef JAJH_dev
	printf("Computed %d initial DSE weights in %gs\n", numRow, IzDseEdWtTT);
#endif
	printf("solve:: %d basic structurals: computed %d initial DSE weights in %gs, %d, %d, %g\n",
	numBasicStructurals, numRow, IzDseEdWtTT, numBasicStructurals, numRow, IzDseEdWtTT);
      } else {
	printf("solve:: %d basic structurals: starting from B=I so unit initial DSE weights\n", numBasicStructurals);
      }
    }
    //Indicate that edge weights are known
    model->mlFg_haveEdWt = 1;
  }
  //  printf("model->mlFg_haveEdWt 3 = %d\n", model->mlFg_haveEdWt);cout<<flush;
  
  model->computeDual();
  
  //  printf("Solve: Computed dual\n");cout<<flush;

#ifdef JAJH_dev
  bool rp_bs_cond = false;
  if (rp_bs_cond) {
    double bs_cond = an_bs_cond(ptr_model);
    printf("Initial basis condition estimate is %g\n", bs_cond);
  }
#endif
  
  //  printf("HDual::solve - Calling model->computeDualInfeasInDual\n");cout<<flush;
  model->computeDualInfeasInDual(&dualInfeasCount);
  solvePhase = dualInfeasCount > 0 ? 1 : 2;
  
  //  printf("Solve: Computed phase = %d\n", solvePhase);cout<<flush;

  // Find largest dual and adjust the dual tolerance accordingly
  double largeDual = 0;
  for (int i = 0; i < numTot; i++) {
    if (model->getNonbasicFlag()[i]) {
      double myDual = fabs(workDual[i] * jMove[i]);
      if (largeDual < myDual)
	largeDual = myDual;
    }
  }
  
  // Check that the model is OK to solve:
  //
  // Level 0 just checks the flags
  //
  // Level 1 also checks that the basis is OK and that the necessary
  // data in work* is populated.
  //
  // Level 2 (will) checks things like the nonbasic duals and basic
  // primal values
  //
  // Level 3 (will) checks expensive things like the INVERT and
  // steepeest edge weights
  //
  bool ok = model->OKtoSolve(1, solvePhase);
  if (!ok) {printf("NOT OK TO SOLVE???\n");cout<<flush;}
  //  assert(ok);
  
  //  rp_hsol_sol(ptr_model);


  //	Analyse the initial values of primal and dual variables
  //  an_iz_vr_v();
  
  // The major solving loop
  
  while (solvePhase) {
#ifdef JAJH_dev
    int it0 = model->numberIteration;
    //printf("HDual::solve Phase %d: Iteration %d; totalTime = %g; timer.getTime = %g\n", solvePhase, model->numberIteration, model->totalTime, model->timer.getTime());
#endif
    switch (solvePhase) {
    case 1:
      solve_phase1();
#ifdef JAJH_dev
      n_ph1_du_it += (model->numberIteration - it0);
#endif
      break;
    case 2:
      solve_phase2();
#ifdef JAJH_dev
      n_ph2_du_it += (model->numberIteration - it0);
#endif
      break;
    case 4:
      break;
    default:
      solvePhase = 0;
      break;
    }
    // Jump for primal
    if (solvePhase == 4)
      break;
    // Possibly bail out
    if (SolveBailout)
      break;
  }
  
#ifdef JAJH_dev
  // Report the ticks before primal
  if (dual_variant == HDUAL_VARIANT_PLAIN) {
    int reportList[] = { HTICK_INVERT, HTICK_CHUZR1, HTICK_BTRAN,
			 HTICK_PRICE, HTICK_CHUZC1, HTICK_CHUZC2, HTICK_CHUZC3,
			 HTICK_FTRAN, HTICK_FTRAN_MIX, HTICK_FTRAN_DSE,
			 HTICK_UPDATE_DUAL, HTICK_UPDATE_PRIMAL, HTICK_UPDATE_WEIGHT,
			 HTICK_UPDATE_FACTOR };
    int reportCount = sizeof(reportList) / sizeof(int);
    model->timer.report(reportCount, reportList);
  }
  
  if (dual_variant == HDUAL_VARIANT_TASKS) {
    int reportList[] = { HTICK_INVERT, HTICK_CHUZR1, HTICK_BTRAN,
			 HTICK_PRICE, HTICK_CHUZC1, HTICK_CHUZC2, HTICK_CHUZC3,
			 HTICK_FTRAN, HTICK_FTRAN_MIX, HTICK_FTRAN_DSE,
			 HTICK_UPDATE_DUAL, HTICK_UPDATE_PRIMAL, HTICK_UPDATE_WEIGHT,
			 HTICK_UPDATE_FACTOR, HTICK_GROUP1, HTICK_GROUP2 };
    int reportCount = sizeof(reportList) / sizeof(int);
    model->timer.report(reportCount, reportList);
  }
  
  if (dual_variant == HDUAL_VARIANT_MULTI) {
    int reportList[] = { HTICK_INVERT, HTICK_CHUZR1, HTICK_BTRAN,
			 HTICK_PRICE, HTICK_CHUZC1, HTICK_CHUZC2, HTICK_CHUZC3,
			 HTICK_FTRAN, HTICK_FTRAN_MIX, HTICK_FTRAN_DSE,
			 HTICK_UPDATE_DUAL, HTICK_UPDATE_PRIMAL, HTICK_UPDATE_WEIGHT,
			 HTICK_UPDATE_FACTOR, HTICK_UPDATE_ROW_EP };
    int reportCount = sizeof(reportList) / sizeof(int);
    model->timer.report(reportCount, reportList);
    printf("PAMI   %-20s    CUTOFF  %6g    PERSISTENSE  %6g\n",
	   model->modelName.c_str(), model->dblOption[DBLOPT_PAMI_CUTOFF],
	   model->numberIteration / (1.0 + multi_iteration));
  }
#endif
  
  if (model->problemStatus != LP_Status_OutOfTime) {
    // Use primal to clean up if not out of time
#ifdef JAJH_dev
    int it0 = model->numberIteration;
#endif
    if (solvePhase == 4) {
      HPrimal hPrimal;
      hPrimal.TimeLimitValue = TimeLimitValue;
      hPrimal.solvePhase2(model);
      //Add in the count and time for any primal rebuilds
      totalRebuildTime += hPrimal.totalRebuildTime;
      totalRebuilds += hPrimal.totalRebuilds;
    }
#ifdef JAJH_dev
    n_pr_it += (model->numberIteration - it0);
#endif
  }
  // Save the solved results
  model->totalTime += model->timer.getTime();
  
#ifdef JAJH_dev
  if (n_ph1_du_it + n_ph2_du_it + n_pr_it != model->numberIteration) {
    printf("Iteration total error \n");
  }
  printf("Iterations [Ph1 %d; Ph2 %d; Pr %d] Total %d\n", n_ph1_du_it,
  		n_ph2_du_it, n_pr_it, model->numberIteration);
  if (EdWt_Mode == EdWt_Mode_Dvx) {
    printf("Devex: n_dvx_fwk = %d; Average n_dvx_it = %d\n", n_dvx_fwk,
	   model->numberIteration / n_dvx_fwk);
  }
  if (rp_bs_cond) {
    double bs_cond = an_bs_cond(ptr_model);
    printf("Optimal basis condition estimate is %g\n", bs_cond);
    }
  //  rp_hsol_sol(ptr_model);
  ok = model->OKtoSolve(1, solvePhase);
  if (!ok) {printf("NOT OK After Solve???\n");cout<<flush;}
  //  assert(ok);
  printf("model->mlFg_Report() 9\n");cout<<flush;  model->mlFg_Report();cout<<flush;

  printf("Time: Total inverts =  %4d; Total invert  time = %11.4g of Total time = %11.4g", model->totalInverts, model->totalInvertTime, model->totalTime);
  if (model->totalTime > 0.001) 
    printf(" (%6.2f%%)\n", (100*model->totalInvertTime)/model->totalTime);
  else
    printf("\n");
  cout << flush;
  printf("Time: Total rebuilds = %4d; Total rebuild time = %11.4g of Total time = %11.4g", totalRebuilds, totalRebuildTime, model->totalTime);
  if (model->totalTime > 0.001) 
    printf(" (%6.2f%%)\n", (100*totalRebuildTime)/model->totalTime);
  else
    printf("\n");
  cout << flush;
 
#endif
}